

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

double double_conversion::Strtod(Vector<const_char> buffer,int exponent)

{
  long lVar1;
  double dVar2;
  long in_FS_OFFSET;
  int updated_exponent;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  Vector<const_char> *in_stack_fffffffffffffc80;
  undefined1 *__s;
  int space_size;
  Vector<const_char> *this;
  undefined8 in_stack_fffffffffffffc98;
  int exponent_00;
  undefined1 local_338 [32];
  undefined1 local_318 [40];
  Vector<const_char> in_stack_fffffffffffffd10;
  Vector<const_char> in_stack_fffffffffffffd20;
  int *in_stack_fffffffffffffd40;
  
  exponent_00 = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = local_318;
  memset(__s,0xaa,0x30c);
  space_size = (int)((ulong)__s >> 0x20);
  local_338._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_338._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this = (Vector<const_char> *)local_338;
  Vector<const_char>::Vector(this);
  TrimAndCut(in_stack_fffffffffffffd20,exponent_00,(char *)this,space_size,in_stack_fffffffffffffc80
             ,in_stack_fffffffffffffd40);
  dVar2 = StrtodTrimmed(in_stack_fffffffffffffd10,space_size);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return dVar2;
  }
  __stack_chk_fail();
}

Assistant:

double Strtod(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  return StrtodTrimmed(trimmed, updated_exponent);
}